

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

ON_wString __thiscall ON_wString::Example(ON_wString *this,ExampleType t)

{
  ON_Internal_Empty_wString *pOVar1;
  ON_wString *this_00;
  ON_wString *this_01;
  ON_wString OStack_118;
  ON_wString local_110;
  ON_wString local_108;
  ON_wString local_100;
  ON_wString local_f8;
  ON_wString local_f0;
  ON_wString local_e8;
  ON_wString local_e0;
  ON_wString local_d8;
  ON_wString local_d0;
  ON_wString local_c8;
  ON_wString local_c0;
  ON_wString local_b8;
  ON_wString local_b0;
  ON_wString local_a8;
  ON_wString local_a0;
  ON_wString local_98;
  ON_wString local_90;
  ON_wString local_88;
  ON_wString local_80;
  ON_wString local_78;
  ON_wString local_70;
  ON_wString local_68;
  ON_wString local_60;
  ON_wString local_58;
  ON_wString local_50;
  ON_wString local_48;
  ON_wString local_40;
  ON_wString local_38;
  ON_wString s;
  ON_wString local_28;
  ON_wString local_20;
  
  this_00 = &OStack_118;
  this_01 = &s;
  ON_wString(this_01);
  switch(t) {
  case XML:
    ON_wString(&local_c8,L"The math teacher said, &quot;It isn&apos;t true that 2");
    operator+(&local_c0,(wchar_t)&local_c8);
    ON_wString(&local_d0,L"=3");
    operator+(&local_b8,&local_c0);
    operator+(&local_b0,(wchar_t)&local_b8);
    ON_wString(&local_d8,L" &amp; ");
    operator+(&local_a8,&local_b0);
    operator+(&local_a0,(wchar_t)&local_a8);
    ON_wString(&local_e0,L" &gt; 3");
    operator+(&local_98,&local_a0);
    operator+(&local_90,(wchar_t)&local_98);
    ON_wString(&local_e8,L" &amp; ");
    operator+(&local_88,&local_90);
    operator+(&local_80,(wchar_t)&local_88);
    ON_wString(&local_f0,L" &lt; 2 ");
    operator+(&local_78,&local_80);
    operator+(&local_70,(wchar_t)&local_78);
    ON_wString(&local_f8,L" &amp; ");
    operator+(&local_68,&local_70);
    operator+(&local_60,(wchar_t)&local_68);
    ON_wString(&local_100,L" &gt; ");
    operator+(&local_58,&local_60);
    operator+(&local_50,(wchar_t)&local_58);
    ON_wString(&local_108,L"99.&quot; ");
    operator+(&local_48,&local_50);
    ON_wString(&local_110,L'\xd83d',1);
    operator+(&local_40,&local_48);
    ON_wString(&local_20,L'\xddd1',1);
    operator+(&local_38,&local_40);
    ON_wString(&local_28,L"!");
    operator+(&OStack_118,&local_38);
    operator=(&s,&OStack_118);
LAB_0067117b:
    ~ON_wString(&OStack_118);
    ~ON_wString(&local_28);
    ~ON_wString(&local_38);
    ~ON_wString(&local_20);
    ~ON_wString(&local_40);
    ~ON_wString(&local_110);
    ~ON_wString(&local_48);
    ~ON_wString(&local_108);
    ~ON_wString(&local_50);
    ~ON_wString(&local_58);
    ~ON_wString(&local_100);
    ~ON_wString(&local_60);
    ~ON_wString(&local_68);
    ~ON_wString(&local_f8);
    ~ON_wString(&local_70);
    ~ON_wString(&local_78);
    ~ON_wString(&local_f0);
    ~ON_wString(&local_80);
    ~ON_wString(&local_88);
    ~ON_wString(&local_e8);
    ~ON_wString(&local_90);
    ~ON_wString(&local_98);
    ~ON_wString(&local_e0);
    ~ON_wString(&local_a0);
    ~ON_wString(&local_a8);
    ~ON_wString(&local_d8);
    ~ON_wString(&local_b0);
    ~ON_wString(&local_b8);
    ~ON_wString(&local_d0);
    ~ON_wString(&local_c0);
    this_00 = &local_c8;
    break;
  case XMLalternate1:
    ON_wString(&OStack_118,
               L"The math teacher said, &quot;It isn&apos;t true that 2&#xb3;=3&#xb2; &amp; &#x3a3; &gt; 3&#xa2; &amp; &#x3a3; &lt; 2 &#x20bd; &amp; &#x3a3; &gt; &#x20ac;99.&quot; &#x1f5d1;!"
              );
    operator=(&s,&OStack_118);
    break;
  case XMLalternate2:
    ON_wString(&OStack_118,
               L"The math teacher said, &quot;It isn&apos;t true that 2&#xb3;=3&#xb2; &amp; &#x3A3; &gt; 3&#xA2; &amp; &#x3A3; &lt; 2 &#x20BD; &amp; &#x3A3; &gt; &#x20AC;99.&quot; &#x1F5D1;!"
              );
    operator=(&s,&OStack_118);
    this_00 = &OStack_118;
    break;
  case XMLalternate3:
    ON_wString(&OStack_118,
               L"The math teacher said, &#34;It isn&#39;t true that 2&#179;=3&#178; &amp; &#931; &#62; 3&#162; &#38; &#931; &#60; 2 &#8381; &#38; &#931; &#62; &#8364;99.&#34; &#128465;!"
              );
    operator=(&s,&OStack_118);
    this_00 = &OStack_118;
    break;
  default:
    if (t == RichText) {
      RichTextExample(&OStack_118,&ON_Font::Default);
      operator=(&s,&OStack_118);
      this_00 = &OStack_118;
    }
    else {
      if (t == UTF16) {
        ON_wString(&local_c8,L"The math teacher said, \"It isn\'t true that 2");
        operator+(&local_c0,(wchar_t)&local_c8);
        ON_wString(&local_d0,L"=3");
        operator+(&local_b8,&local_c0);
        operator+(&local_b0,(wchar_t)&local_b8);
        ON_wString(&local_d8,L" & ");
        operator+(&local_a8,&local_b0);
        operator+(&local_a0,(wchar_t)&local_a8);
        ON_wString(&local_e0,L" > 3");
        operator+(&local_98,&local_a0);
        operator+(&local_90,(wchar_t)&local_98);
        ON_wString(&local_e8,L" & ");
        operator+(&local_88,&local_90);
        operator+(&local_80,(wchar_t)&local_88);
        ON_wString(&local_f0,L" < 2 ");
        operator+(&local_78,&local_80);
        operator+(&local_70,(wchar_t)&local_78);
        ON_wString(&local_f8,L" & ");
        operator+(&local_68,&local_70);
        operator+(&local_60,(wchar_t)&local_68);
        ON_wString(&local_100,L" > ");
        operator+(&local_58,&local_60);
        operator+(&local_50,(wchar_t)&local_58);
        ON_wString(&local_108,L"99.\" ");
        operator+(&local_48,&local_50);
        ON_wString(&local_110,L'\xd83d',1);
        operator+(&local_40,&local_48);
        ON_wString(&local_20,L'\xddd1',1);
        operator+(&local_38,&local_40);
        ON_wString(&local_28,L"!");
        operator+(&OStack_118,&local_38);
        operator=(&s,&OStack_118);
        goto LAB_0067117b;
      }
      if (t != WideChar) goto LAB_00671366;
      ON_wString(&local_c0,L"The math teacher said, \"It isn\'t true that 2");
      operator+(&local_b8,(wchar_t)&local_c0);
      ON_wString(&local_c8,L"=3");
      operator+(&local_b0,&local_b8);
      operator+(&local_a8,(wchar_t)&local_b0);
      ON_wString(&local_d0,L" & ");
      operator+(&local_a0,&local_a8);
      operator+(&local_98,(wchar_t)&local_a0);
      ON_wString(&local_d8,L" > 3");
      operator+(&local_90,&local_98);
      operator+(&local_88,(wchar_t)&local_90);
      ON_wString(&local_e0,L" & ");
      operator+(&local_80,&local_88);
      operator+(&local_78,(wchar_t)&local_80);
      ON_wString(&local_e8,L" < 2 ");
      operator+(&local_70,&local_78);
      operator+(&local_68,(wchar_t)&local_70);
      ON_wString(&local_f0,L" & ");
      operator+(&local_60,&local_68);
      operator+(&local_58,(wchar_t)&local_60);
      ON_wString(&local_f8,L" > ");
      operator+(&local_50,&local_58);
      operator+(&local_48,(wchar_t)&local_50);
      ON_wString(&local_100,L"99.\" ");
      operator+(&local_40,&local_48);
      ON_wString(&local_108,L'🗑',1);
      operator+(&local_38,&local_40);
      ON_wString(&local_110,L"!");
      operator+(&OStack_118,&local_38);
      operator=(&s,&OStack_118);
      ~ON_wString(&OStack_118);
      ~ON_wString(&local_110);
      ~ON_wString(&local_38);
      ~ON_wString(&local_108);
      ~ON_wString(&local_40);
      ~ON_wString(&local_100);
      ~ON_wString(&local_48);
      ~ON_wString(&local_50);
      ~ON_wString(&local_f8);
      ~ON_wString(&local_58);
      ~ON_wString(&local_60);
      ~ON_wString(&local_f0);
      ~ON_wString(&local_68);
      ~ON_wString(&local_70);
      ~ON_wString(&local_e8);
      ~ON_wString(&local_78);
      ~ON_wString(&local_80);
      ~ON_wString(&local_e0);
      ~ON_wString(&local_88);
      ~ON_wString(&local_90);
      ~ON_wString(&local_d8);
      ~ON_wString(&local_98);
      ~ON_wString(&local_a0);
      ~ON_wString(&local_d0);
      ~ON_wString(&local_a8);
      ~ON_wString(&local_b0);
      ~ON_wString(&local_c8);
      ~ON_wString(&local_b8);
      this_00 = &local_c0;
    }
  }
  ~ON_wString(this_00);
LAB_00671366:
  pOVar1 = &empty_wstring;
  if (s.m_s != (wchar_t *)0x0) {
    pOVar1 = (ON_Internal_Empty_wString *)(s.m_s + -3);
  }
  if ((pOVar1->header).string_length < 1) {
    this_01 = &EmptyString;
  }
  ON_wString(this,this_01);
  ~ON_wString(&s);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::Example(ON_wString::ExampleType t)
{
  ON_wString s;
  switch (t)
  {
  case ON_wString::ExampleType::Empty:
    break;

  case ON_wString::ExampleType::WideChar:
    s = ON_wString(
      ON_wString(L"The math teacher said, \"It isn't true that 2")
      + ON_wString::Superscript3 + ON_wString(L"=3") + ON_wString::Superscript2
      + ON_wString(L" & ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" > 3")
      + ON_wString::CentSign
      + ON_wString(L" & ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" < 2 ")
      + ON_wString::RubleSign
      + ON_wString(L" & ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" > ")
      + ON_wString::EuroSign
      + ON_wString(L"99.\" ")
#if defined(ON_SIZEOF_WCHAR_T) && ON_SIZEOF_WCHAR_T >= 4
      + ON_wString((wchar_t)0x1F5D1) // UTF-32 encoding for WASTEBASKET U+1F5D1
#else
      + ON_wString((wchar_t)0xD83D) // (0xD83D, 0xDDD1) is the UTF-16 surrogate pair encoding for WASTEBASKET U+1F5D1
      + ON_wString((wchar_t)0xDDD1)
#endif
      + ON_wString(L"!")
    );
    break;

  case ON_wString::ExampleType::UTF16:
    s = ON_wString(
      ON_wString(L"The math teacher said, \"It isn't true that 2")
      + ON_wString::Superscript3 + ON_wString(L"=3") + ON_wString::Superscript2
      + ON_wString(L" & ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" > 3")
      + ON_wString::CentSign
      + ON_wString(L" & ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" < 2 ")
      + ON_wString::RubleSign
      + ON_wString(L" & ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" > ")
      + ON_wString::EuroSign
      + ON_wString(L"99.\" ")
      + ON_wString((wchar_t)(wchar_t)0xD83D) // (0xD83D, 0xDDD1) is the UTF-16 surrogate pair encoding for WASTEBASKET U+1F5D1
      + ON_wString((wchar_t)(wchar_t)0xDDD1)
      + ON_wString(L"!")
    );
    break;

  case ON_wString::ExampleType::RichText:
    s = ON_wString::RichTextExample(&ON_Font::Default);
    break;

  case ON_wString::ExampleType::XML:
    /// The UTF string as an XML value with special characters encoded in the &amp;amp; format
    /// and code points above basic latin UTF encoded.
    s = ON_wString(
      ON_wString(L"The math teacher said, &quot;It isn&apos;t true that 2")
      + ON_wString::Superscript3 + ON_wString(L"=3") + ON_wString::Superscript2
      + ON_wString(L" &amp; ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" &gt; 3")
      + ON_wString::CentSign
      + ON_wString(L" &amp; ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" &lt; 2 ")
      + ON_wString::RubleSign
      + ON_wString(L" &amp; ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" &gt; ")
      + ON_wString::EuroSign
      + ON_wString(L"99.&quot; ")
      + ON_wString((wchar_t)(wchar_t)0xD83D) // (0xD83D, 0xDDD1) is the UTF-16 surrogate pair encoding for WASTEBASKET U+1F5D1
      + ON_wString((wchar_t)(wchar_t)0xDDD1)
      + ON_wString(L"!")
      );
      break;

  case ON_wString::ExampleType::XMLalternate1:
    /// The UTF string as an XML value with special characters encoded in the &amp;amp; format
    /// and code points above basic latin encoded in the &#hhhh; format
    /// using  lower case hex digits (0123456789abcdef).
    s = ON_wString(L"The math teacher said, &quot;It isn&apos;t true that 2&#xb3;=3&#xb2; &amp; &#x3a3; &gt; 3&#xa2; &amp; &#x3a3; &lt; 2 &#x20bd; &amp; &#x3a3; &gt; &#x20ac;99.&quot; &#x1f5d1;!");
    break;

  case ON_wString::ExampleType::XMLalternate2:
    /// The UTF string as an XML value with special characters encoded in the &amp;amp; format
    /// and code points above basic latin encoded in the hexadecimal &amp;#xhhhh; format
    /// with  upper case hex digits (0123456789ABCDEF).
    s = ON_wString(L"The math teacher said, &quot;It isn&apos;t true that 2&#xb3;=3&#xb2; &amp; &#x3A3; &gt; 3&#xA2; &amp; &#x3A3; &lt; 2 &#x20BD; &amp; &#x3A3; &gt; &#x20AC;99.&quot; &#x1F5D1;!");
    break;

  case ON_wString::ExampleType::XMLalternate3:
    /// The UTF string as an XML value with special characters and code points above
    /// basic latin encoded in the decimal code point &amp;#nnnn; format.
    s = ON_wString(L"The math teacher said, &#34;It isn&#39;t true that 2&#179;=3&#178; &amp; &#931; &#62; 3&#162; &#38; &#931; &#60; 2 &#8381; &#38; &#931; &#62; &#8364;99.&#34; &#128465;!");
    break;

  default:
    break;
  }

  return s.IsNotEmpty() ? s : ON_wString::EmptyString;
}